

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O2

bool __thiscall Scs::Socket::IsInvalid(Socket *this)

{
  uint __i;
  int iVar1;
  long lVar2;
  uint *puVar3;
  bool bVar4;
  timeval tmval;
  fd_set socketSet;
  
  iVar1 = this->m_socket;
  if (iVar1 == -1) {
    bVar4 = true;
  }
  else {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      socketSet.fds_bits[lVar2] = 0;
    }
    socketSet.fds_bits[iVar1 / 0x40] = socketSet.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f)
    ;
    tmval.tv_sec = 0;
    tmval.tv_usec = 1000;
    iVar1 = select(iVar1 + 1,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)&socketSet,(timeval *)&tmval);
    if (iVar1 == -1) {
      puVar3 = (uint *)__errno_location();
      bVar4 = false;
      LogWriteLine("Socket IsInvalid() failed: %d",(ulong)*puVar3);
    }
    else {
      bVar4 = iVar1 == 1;
    }
  }
  return bVar4;
}

Assistant:

bool Socket::IsInvalid() const
{
	if (m_socket == INVALID_SOCKET)
		return true;
	fd_set socketSet;
	FD_ZERO(&socketSet);
	FD_SET(m_socket, &socketSet);
	timeval tmval;
	tmval.tv_sec = 0;
	tmval.tv_usec = 1000;
	int result = select(static_cast<int>(m_socket + 1), nullptr, nullptr, &socketSet, &tmval);
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR)
	{
		LogWriteLine("Socket IsInvalid() failed: %d", lastError);
		return false;
	}
	return (result == 1) ? true : false;
}